

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output_attributes
               (xml_buffered_writer *writer,xml_node_struct *node,char_t *indent,
               size_t indent_length,uint flags,uint depth)

{
  size_t __n;
  void *pvVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  char *local_60;
  char local_49;
  xml_attribute_struct *local_48;
  xml_attribute_struct *a;
  char_t enquotation_char;
  char_t *default_name;
  uint depth_local;
  uint flags_local;
  size_t indent_length_local;
  char_t *indent_local;
  xml_node_struct *node_local;
  xml_buffered_writer *writer_local;
  
  __n = (size_t)(flags & 0x200);
  pvVar1 = (void *)CONCAT71((int7)((ulong)indent >> 8),0x22);
  local_49 = '\'';
  if ((flags & 0x200) == 0) {
    local_49 = '\"';
  }
  for (local_48 = node->first_attribute; local_48 != (xml_attribute_struct *)0x0;
      local_48 = local_48->next_attribute) {
    if ((flags & 0x44) == 0x40) {
      xml_buffered_writer::write(writer,10,pvVar1,__n);
      __n = (size_t)(depth + 1);
      text_output_indent(writer,indent,indent_length,depth + 1);
    }
    else {
      xml_buffered_writer::write(writer,0x20,pvVar1,__n);
    }
    if (local_48->name == (char_t *)0x0) {
      local_60 = ":anonymous";
    }
    else {
      local_60 = local_48->name;
    }
    xml_buffered_writer::write_string(writer,local_60);
    xml_buffered_writer::write(writer,0x3d,(void *)(ulong)(uint)(int)local_49,__n);
    pvVar1 = extraout_RDX;
    if (local_48->value != (char_t *)0x0) {
      __n = (size_t)flags;
      text_output(writer,local_48->value,ctx_special_attr,flags);
      pvVar1 = extraout_RDX_00;
    }
    xml_buffered_writer::write(writer,(int)local_49,pvVar1,__n);
    pvVar1 = extraout_RDX_01;
  }
  return;
}

Assistant:

PUGI_IMPL_FN void node_output_attributes(xml_buffered_writer& writer, xml_node_struct* node, const char_t* indent, size_t indent_length, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");
		const char_t enquotation_char = (flags & format_attribute_single_quote) ? '\'' : '"';

		for (xml_attribute_struct* a = node->first_attribute; a; a = a->next_attribute)
		{
			if ((flags & (format_indent_attributes | format_raw)) == format_indent_attributes)
			{
				writer.write('\n');

				text_output_indent(writer, indent, indent_length, depth + 1);
			}
			else
			{
				writer.write(' ');
			}

			writer.write_string(a->name ? a->name + 0 : default_name);
			writer.write('=', enquotation_char);

			if (a->value)
				text_output(writer, a->value, ctx_special_attr, flags);

			writer.write(enquotation_char);
		}
	}